

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProceduralAssignStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProceduralAssignStatementSyntax,slang::syntax::SyntaxKind&,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          ExpressionSyntax *args_4,Token *args_5)

{
  Token keyword;
  Token semi;
  ProceduralAssignStatementSyntax *this_00;
  ExpressionSyntax *args_local_4;
  Token *args_local_3;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_2;
  NamedLabelSyntax **args_local_1;
  SyntaxKind *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ProceduralAssignStatementSyntax *)allocate(this,0x70,8);
  keyword.kind = args_3->kind;
  keyword._2_1_ = args_3->field_0x2;
  keyword.numFlags.raw = (args_3->numFlags).raw;
  keyword.rawLen = args_3->rawLen;
  keyword.info = args_3->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  slang::syntax::ProceduralAssignStatementSyntax::ProceduralAssignStatementSyntax
            (this_00,*args,*args_1,args_2,keyword,args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }